

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O2

void G_DoCompleted(void)

{
  byte *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  FTextureID FVar7;
  int iVar8;
  level_info_t *plVar9;
  int *piVar10;
  cluster_info_t *cluster;
  cluster_info_t *pcVar11;
  wbplayerstruct_t *pwVar12;
  long lVar13;
  EFinishLevelType mode;
  uint uVar14;
  
  gameaction = ga_nothing;
  if (((uint)(gamestate + GS_FORCEWIPEBURN) < 2) || (gamestate == GS_STARTUP)) {
    return;
  }
  if (gamestate == GS_TITLELEVEL) {
    FString::operator=(&level.MapName,&nextlevel);
    G_DoLoadLevel(startpos,false);
    viewactive = true;
    startpos = 0;
    return;
  }
  if ((level.flags._3_1_ & 0x40) == 0) {
    plVar9 = FindLevelInfo(level.MapName.Chars,true);
    pbVar1 = (byte *)((long)&plVar9->flags + 3);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if (automapactive == true) {
    AM_Stop();
  }
  wminfo.finished_ep = level.cluster + -1;
  FVar7 = FTextureManager::CheckForTexture(&TexMan,((level.info)->PName).Chars,8,1);
  if ((uint)FVar7.texnum < TexMan.Textures.Count) {
    wminfo.LName0 = TexMan.Textures.Array[FVar7.texnum].Texture;
  }
  else {
    wminfo.LName0 = (FTexture *)0x0;
  }
  FString::operator=(&wminfo.current,&level.MapName);
  if (((deathmatch.Value == 0) || (((byte)dmflags.Value & 0x40) == 0)) ||
     ((level.flags._3_1_ & 0x40) != 0)) {
    plVar9 = FindLevelInfo(nextlevel.Chars,false);
    if ((plVar9 == (level_info_t *)0x0) || (iVar8 = strncmp(nextlevel.Chars,"enDSeQ",6), iVar8 == 0)
       ) {
      FString::operator=(&wminfo.next,&nextlevel);
    }
    else {
      FString::operator=(&wminfo.next,&plVar9->MapName);
      FVar7 = FTextureManager::CheckForTexture(&TexMan,(plVar9->PName).Chars,8,1);
      if ((uint)FVar7.texnum < TexMan.Textures.Count) {
        wminfo.LName1 = TexMan.Textures.Array[FVar7.texnum].Texture;
        goto LAB_0045af7a;
      }
    }
    wminfo.LName1 = (FTexture *)0x0;
  }
  else {
    FString::operator=(&wminfo.next,&level.MapName);
    wminfo.LName1 = wminfo.LName0;
  }
LAB_0045af7a:
  CheckWarpTransMap(&wminfo.next,true);
  FString::operator=(&nextlevel,&wminfo.next);
  plVar9 = FindLevelInfo(wminfo.next.Chars,true);
  wminfo.next_ep = plVar9->cluster + -1;
  wminfo.maxkills = level.total_monsters;
  wminfo.maxitems = level.total_items;
  wminfo.maxsecret = level.total_secrets;
  wminfo.maxfrags = 0;
  wminfo.partime = level.partime * 0x23;
  wminfo.sucktime = level.sucktime;
  wminfo.pnum = consoleplayer;
  wminfo.totaltime = level.totaltime;
  piVar10 = &DAT_009ba520;
  pwVar12 = wminfo.plyr;
  iVar8 = level.time;
  for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
    pwVar12->in = playeringame[lVar13];
    iVar6 = piVar10[-1];
    pwVar12->skills = piVar10[-2];
    pwVar12->sitems = iVar6;
    pwVar12->ssecret = *piVar10;
    pwVar12->stime = iVar8;
    uVar2 = *(undefined8 *)(piVar10 + -0x15);
    uVar3 = *(undefined8 *)(piVar10 + -0x13);
    uVar4 = *(undefined8 *)(piVar10 + -0x11);
    *(undefined8 *)pwVar12->frags = *(undefined8 *)(piVar10 + -0x17);
    *(undefined8 *)(pwVar12->frags + 2) = uVar2;
    *(undefined8 *)(pwVar12->frags + 4) = uVar3;
    *(undefined8 *)(pwVar12->frags + 6) = uVar4;
    pwVar12->fragcount = piVar10[-0xf];
    piVar10 = piVar10 + 0xa8;
    pwVar12 = pwVar12 + 1;
  }
  cluster = FindClusterInfo(level.cluster);
  pcVar11 = FindClusterInfo(wminfo.next_ep + 1);
  if (((cluster == pcVar11) && (deathmatch.Value == 0)) && ((cluster->flags & 1) != 0)) {
    uVar14 = 0;
    bVar5 = true;
    mode = FINISH_SameHub;
  }
  else {
    uVar14 = pcVar11->flags & 1;
    mode = FINISH_NoHub - uVar14;
    bVar5 = false;
  }
  G_LeavingHub(mode,cluster,&wminfo);
  for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
    if (playeringame[lVar13] == true) {
      G_PlayerFinishLevel((int)lVar13,mode,changeflags);
    }
  }
  if (bVar5) {
    if ((int)level.flags2 < 0) {
      level_info_t::ClearSnapshot(level.info);
    }
    else {
      G_SnapshotLevel();
      FBehavior::StaticLockLevelVarStrings();
    }
  }
  else {
    G_ClearSnapshots();
    if ((char)uVar14 != '\0') {
      P_ClearACSVars(false);
    }
    level.time = 0;
    level.maptime = 0;
  }
  if ((deathmatch.Value == 0) &&
     ((((byte)level.flags & 1) != 0 || ((cluster == pcVar11 && ((cluster->flags & 1) != 0)))))) {
    G_WorldDone();
    return;
  }
  gamestate = GS_INTERMISSION;
  viewactive = false;
  automapactive = false;
  WI_Start(&wminfo);
  return;
}

Assistant:

void G_DoCompleted (void)
{
	int i; 

	gameaction = ga_nothing;

	if (   gamestate == GS_DEMOSCREEN
		|| gamestate == GS_FULLCONSOLE
		|| gamestate == GS_STARTUP)
	{
		return;
	}

	if (gamestate == GS_TITLELEVEL)
	{
		level.MapName = nextlevel;
		G_DoLoadLevel (startpos, false);
		startpos = 0;
		viewactive = true;
		return;
	}

	// [RH] Mark this level as having been visited
	if (!(level.flags & LEVEL_CHANGEMAPCHEAT))
		FindLevelInfo (level.MapName)->flags |= LEVEL_VISITED;

	if (automapactive)
		AM_Stop ();

	wminfo.finished_ep = level.cluster - 1;
	wminfo.LName0 = TexMan[TexMan.CheckForTexture(level.info->PName, FTexture::TEX_MiscPatch)];
	wminfo.current = level.MapName;

	if (deathmatch &&
		(dmflags & DF_SAME_LEVEL) &&
		!(level.flags & LEVEL_CHANGEMAPCHEAT))
	{
		wminfo.next = level.MapName;
		wminfo.LName1 = wminfo.LName0;
	}
	else
	{
		level_info_t *nextinfo = FindLevelInfo (nextlevel, false);
		if (nextinfo == NULL || strncmp (nextlevel, "enDSeQ", 6) == 0)
		{
			wminfo.next = nextlevel;
			wminfo.LName1 = NULL;
		}
		else
		{
			wminfo.next = nextinfo->MapName;
			wminfo.LName1 = TexMan[TexMan.CheckForTexture(nextinfo->PName, FTexture::TEX_MiscPatch)];
		}
	}

	CheckWarpTransMap (wminfo.next, true);
	nextlevel = wminfo.next;

	wminfo.next_ep = FindLevelInfo (wminfo.next)->cluster - 1;
	wminfo.maxkills = level.total_monsters;
	wminfo.maxitems = level.total_items;
	wminfo.maxsecret = level.total_secrets;
	wminfo.maxfrags = 0;
	wminfo.partime = TICRATE * level.partime;
	wminfo.sucktime = level.sucktime;
	wminfo.pnum = consoleplayer;
	wminfo.totaltime = level.totaltime;

	for (i=0 ; i<MAXPLAYERS ; i++)
	{
		wminfo.plyr[i].in = playeringame[i];
		wminfo.plyr[i].skills = players[i].killcount;
		wminfo.plyr[i].sitems = players[i].itemcount;
		wminfo.plyr[i].ssecret = players[i].secretcount;
		wminfo.plyr[i].stime = level.time;
		memcpy (wminfo.plyr[i].frags, players[i].frags
				, sizeof(wminfo.plyr[i].frags));
		wminfo.plyr[i].fragcount = players[i].fragcount;
	}

	// [RH] If we're in a hub and staying within that hub, take a snapshot
	//		of the level. If we're traveling to a new hub, take stuff from
	//		the player and clear the world vars. If this is just an
	//		ordinary cluster (not a hub), take stuff from the player, but
	//		leave the world vars alone.
	cluster_info_t *thiscluster = FindClusterInfo (level.cluster);
	cluster_info_t *nextcluster = FindClusterInfo (wminfo.next_ep+1);	// next_ep is cluster-1
	EFinishLevelType mode;

	if (thiscluster != nextcluster || deathmatch ||
		!(thiscluster->flags & CLUSTER_HUB))
	{
		if (nextcluster->flags & CLUSTER_HUB)
		{
			mode = FINISH_NextHub;
		}
		else
		{
			mode = FINISH_NoHub;
		}
	}
	else
	{
		mode = FINISH_SameHub;
	}

	// Intermission stats for entire hubs
	G_LeavingHub(mode, thiscluster, &wminfo);

	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
		{ // take away appropriate inventory
			G_PlayerFinishLevel (i, mode, changeflags);
		}
	}

	if (mode == FINISH_SameHub)
	{ // Remember the level's state for re-entry.
		if (!(level.flags2 & LEVEL2_FORGETSTATE))
		{
			G_SnapshotLevel ();
			// Do not free any global strings this level might reference
			// while it's not loaded.
			FBehavior::StaticLockLevelVarStrings();
		}
		else
		{ // Make sure we don't have a snapshot lying around from before.
			level.info->ClearSnapshot();
		}
	}
	else
	{ // Forget the states of all existing levels.
		G_ClearSnapshots ();

		if (mode == FINISH_NextHub)
		{ // Reset world variables for the new hub.
			P_ClearACSVars(false);
		}
		level.time = 0;
		level.maptime = 0;
	}

	if (!deathmatch &&
		((level.flags & LEVEL_NOINTERMISSION) ||
		((nextcluster == thiscluster) && (thiscluster->flags & CLUSTER_HUB))))
	{
		G_WorldDone ();
		return;
	}

	gamestate = GS_INTERMISSION;
	viewactive = false;
	automapactive = false;

// [RH] If you ever get a statistics driver operational, adapt this.
//	if (statcopy)
//		memcpy (statcopy, &wminfo, sizeof(wminfo));

	WI_Start (&wminfo);
}